

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O0

int __thiscall Snes_Spc::cpu_read_smp_reg(Snes_Spc *this,int reg,rel_time_t time)

{
  uint time_00;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int result;
  
  time_00 = (uint)*(byte *)(in_RDI + 0x858 + (long)in_ESI);
  if ((in_ESI - 2U < 2) && (time_00 = (uint)*(byte *)(in_RDI + 0x84a), in_ESI - 2U == 1)) {
    time_00 = dsp_read((Snes_Spc *)CONCAT44(1,in_EDX),time_00);
  }
  return time_00;
}

Assistant:

inline int Snes_Spc::cpu_read_smp_reg( int reg, rel_time_t time )
{
	int result = REGS_IN [reg];
	reg -= r_dspaddr;
	// DSP addr and data
	if ( (unsigned) reg <= 1 ) // 4% 0xF2 and 0xF3
	{
		result = REGS [r_dspaddr];
		if ( (unsigned) reg == 1 )
			result = dsp_read( time ); // 0xF3
	}
	return result;
}